

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O0

int ApplyFiltersAndEncode
              (uint8_t *alpha,int width,int height,size_t data_size,int method,int filter,
              int reduce_levels,int effort_level,uint8_t **output,size_t *output_size,
              WebPAuxStats *stats)

{
  void *pvVar1;
  size_t sVar2;
  uint8_t *puVar3;
  int in_R9D;
  undefined8 *in_stack_00000018;
  size_t *in_stack_00000020;
  FilterTrial trial;
  uint8_t *filtered_alpha;
  uint32_t try_map;
  FilterTrial best;
  int ok;
  size_t in_stack_fffffffffffffdb0;
  uint64_t in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  uint8_t *in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  uint8_t *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe40;
  uint8_t *in_stack_fffffffffffffe48;
  FilterTrial *in_stack_fffffffffffffe50;
  uint local_12c;
  uint8_t *local_128;
  VP8BitWriter aVStack_120 [4];
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  int local_2c;
  int local_28;
  
  local_2c = 1;
  local_28 = in_R9D;
  local_12c = GetFilterMap(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
                           in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                           in_stack_fffffffffffffdc0);
  InitFilterTrial((FilterTrial *)0x16fb94);
  if (local_12c == 1) {
    local_2c = EncodeAlphaInternal(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                                   in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                                   in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                                   in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                   in_stack_fffffffffffffe50);
  }
  else {
    pvVar1 = WebPSafeMalloc(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    if (pvVar1 == (void *)0x0) {
      return 0;
    }
    local_28 = 0;
    for (; local_2c != 0 && local_12c != 0; local_12c = local_12c >> 1) {
      if ((local_12c & 1) != 0) {
        local_2c = EncodeAlphaInternal(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                                       in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                                       in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                                       in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                       in_stack_fffffffffffffe50);
        if ((local_2c == 0) || (local_128 <= in_stack_fffffffffffffdd0)) {
          VP8BitWriterWipeOut((VP8BitWriter *)0x16fcce);
        }
        else {
          VP8BitWriterWipeOut((VP8BitWriter *)0x16fca7);
          memcpy(&local_128,&stack0xfffffffffffffdd0,0xf8);
        }
      }
      local_28 = local_28 + 1;
    }
    WebPSafeFree((void *)0x16fd05);
  }
  if (local_2c == 0) {
    VP8BitWriterWipeOut((VP8BitWriter *)0x16fe75);
  }
  else {
    if (trial.score != 0) {
      *(undefined4 *)(trial.score + 0x94) = local_5c;
      *(undefined4 *)(trial.score + 0x98) = local_58;
      *(undefined4 *)(trial.score + 0x9c) = local_54;
      *(undefined4 *)(trial.score + 0xa0) = local_50;
      *(undefined4 *)(trial.score + 0xa4) = local_4c;
      *(undefined4 *)(trial.score + 0xa8) = local_48;
      *(undefined4 *)(trial.score + 0xac) = local_44;
      *(undefined4 *)(trial.score + 0xb0) = local_40;
    }
    sVar2 = VP8BitWriterSize(aVStack_120);
    *in_stack_00000020 = sVar2;
    puVar3 = VP8BitWriterBuf(aVStack_120);
    *in_stack_00000018 = puVar3;
  }
  return local_2c;
}

Assistant:

static int ApplyFiltersAndEncode(const uint8_t* alpha, int width, int height,
                                 size_t data_size, int method, int filter,
                                 int reduce_levels, int effort_level,
                                 uint8_t** const output,
                                 size_t* const output_size,
                                 WebPAuxStats* const stats) {
  int ok = 1;
  FilterTrial best;
  uint32_t try_map =
      GetFilterMap(alpha, width, height, filter, effort_level);
  InitFilterTrial(&best);

  if (try_map != FILTER_TRY_NONE) {
    uint8_t* filtered_alpha =  (uint8_t*)WebPSafeMalloc(1ULL, data_size);
    if (filtered_alpha == NULL) return 0;

    for (filter = WEBP_FILTER_NONE; ok && try_map; ++filter, try_map >>= 1) {
      if (try_map & 1) {
        FilterTrial trial;
        ok = EncodeAlphaInternal(alpha, width, height, method, filter,
                                 reduce_levels, effort_level, filtered_alpha,
                                 &trial);
        if (ok && trial.score < best.score) {
          VP8BitWriterWipeOut(&best.bw);
          best = trial;
        } else {
          VP8BitWriterWipeOut(&trial.bw);
        }
      }
    }
    WebPSafeFree(filtered_alpha);
  } else {
    ok = EncodeAlphaInternal(alpha, width, height, method, WEBP_FILTER_NONE,
                             reduce_levels, effort_level, NULL, &best);
  }
  if (ok) {
#if !defined(WEBP_DISABLE_STATS)
    if (stats != NULL) {
      stats->lossless_features = best.stats.lossless_features;
      stats->histogram_bits = best.stats.histogram_bits;
      stats->transform_bits = best.stats.transform_bits;
      stats->cache_bits = best.stats.cache_bits;
      stats->palette_size = best.stats.palette_size;
      stats->lossless_size = best.stats.lossless_size;
      stats->lossless_hdr_size = best.stats.lossless_hdr_size;
      stats->lossless_data_size = best.stats.lossless_data_size;
    }
#else
    (void)stats;
#endif
    *output_size = VP8BitWriterSize(&best.bw);
    *output = VP8BitWriterBuf(&best.bw);
  } else {
    VP8BitWriterWipeOut(&best.bw);
  }
  return ok;
}